

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Vec_Ptr_t * temporaryLtlStore(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  void **ppvVar1;
  void *Entry;
  uint uVar2;
  ulong uVar3;
  Vec_Ptr_t *p_00;
  int i;
  
  if (pNtk != (Abc_Ntk_t *)0x0) {
    p_00 = pNtk->vLtlProperties;
    uVar2 = p_00->nSize;
    i = 0;
    if (0 < (int)uVar2) {
      p = (Vec_Ptr_t *)malloc(0x10);
      uVar3 = 8;
      if (8 < uVar2) {
        uVar3 = (ulong)uVar2;
      }
      p->nSize = 0;
      p->nCap = (int)uVar3;
      ppvVar1 = (void **)malloc(uVar3 << 3);
      p->pArray = ppvVar1;
      for (; i < (int)uVar2; i = i + 1) {
        Entry = Vec_PtrEntry(p_00,i);
        Vec_PtrPush(p,Entry);
        p_00 = pNtk->vLtlProperties;
        uVar2 = p_00->nSize;
      }
      if (p->nSize == uVar2) {
        return p;
      }
      __assert_fail("Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                    ,199,"Vec_Ptr_t *temporaryLtlStore(Abc_Ntk_t *)");
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t *temporaryLtlStore( Abc_Ntk_t *pNtk )
{
    Vec_Ptr_t *tempStore;
    char *pFormula;
    int i;

    if( pNtk && Vec_PtrSize( pNtk->vLtlProperties ) > 0 )
    {
        tempStore = Vec_PtrAlloc( Vec_PtrSize( pNtk->vLtlProperties ) );
        Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
            Vec_PtrPush( tempStore, pFormula );
        assert( Vec_PtrSize( tempStore ) == Vec_PtrSize( pNtk->vLtlProperties ) );
        return tempStore;
    }
    else
        return NULL;
}